

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

int helics::readSize(string_view val)

{
  int iVar1;
  void *pvVar2;
  size_t *in_RCX;
  ulong uVar3;
  char *__s;
  size_t __n_00;
  utilities *this;
  size_type __n;
  size_t sVar4;
  string_view input;
  
  __s = val._M_str;
  __n_00 = val._M_len;
  if (__n_00 == 0) {
    sVar4 = 0xffffffffffffffff;
  }
  else {
    pvVar2 = memchr(__s,0x5b,__n_00);
    in_RCX = (size_t *)((long)pvVar2 - (long)__s);
    sVar4 = -(ulong)(pvVar2 == (void *)0x0) | (ulong)in_RCX;
  }
  if (sVar4 < 2) {
    uVar3 = sVar4 + 1;
    iVar1 = 0;
    if (uVar3 < __n_00) {
      do {
        if ((__s[uVar3] != ']') && (__s[uVar3] != ' ')) goto LAB_00225e90;
        uVar3 = uVar3 + 1;
      } while (__n_00 != uVar3);
      uVar3 = 0xffffffffffffffff;
LAB_00225e90:
      if ((uVar3 != 0xffffffffffffffff) && (iVar1 = 1, sVar4 != __n_00)) {
        iVar1 = 0;
        do {
          iVar1 = iVar1 + (uint)(__s[sVar4] == ';' || __s[sVar4] == ',');
          sVar4 = sVar4 + 1;
        } while (__n_00 != sVar4);
        iVar1 = iVar1 + 1;
      }
    }
  }
  else {
    if (__n_00 == 0) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,0)
      ;
    }
    this = (utilities *)(sVar4 - 1);
    if ((utilities *)(__n_00 - 1) < (utilities *)(sVar4 - 1)) {
      this = (utilities *)(__n_00 - 1);
    }
    input._M_str = (char *)0x0;
    input._M_len = (size_t)(__s + 1);
    iVar1 = gmlc::utilities::strViewToInteger<int>(this,input,in_RCX);
  }
  return iVar1;
}

Assistant:

static int readSize(std::string_view val)
{
    auto firstBracket = val.find_first_of('[');
    if (firstBracket > 1) {
        try {
            auto size = numConv<int>(val.substr(1, firstBracket - 1));
            return size;
        }
        // NOLINTNEXTLINE
        catch (const std::invalid_argument&) {
            // go to the alternative path if this fails
        }
    }
    if (val.find_first_not_of(" ]", firstBracket + 1) == std::string_view::npos) {
        return 0;
    }
    auto res = std::count_if(val.begin() + firstBracket,
                             val.end(),
                             [](auto nextChar) { return (nextChar == ',') || (nextChar == ';'); }) +
        1;
    return static_cast<int>(res);
}